

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O1

void __thiscall ImageInput::ImageInput(ImageInput *this,string *name)

{
  pointer pcVar1;
  pointer *__ptr;
  
  this->_vptr_ImageInput = (_func_int **)&PTR__ImageInput_00262360;
  std::ifstream::ifstream(&this->file);
  (this->buffer)._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  this->isp = (istream *)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  (this->_filename)._M_dataplus._M_p = (pointer)&(this->_filename).field_2;
  (this->_filename)._M_string_length = 0;
  (this->_filename).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)&this->nativeBuffer16 = 0;
  *(undefined8 *)&this->field_0x268 = 0;
  *(undefined8 *)&this->field_0x270 = 0;
  (this->nativeBuffer8).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nativeBuffer8).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nativeBuffer8).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&this->images = 0;
  *(undefined8 *)&this->field_0x298 = 0;
  *(undefined8 *)&this->field_0x2a0 = 0;
  this->curSubimage = 0xffffffff;
  this->curMiplevel = 0xffffffff;
  *(undefined8 *)&(this->sendWarning).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->sendWarning).super__Function_base._M_functor + 8) = 0;
  (this->sendWarning).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->sendWarning)._M_invoker = (_Invoker_type)0x0;
  return;
}

Assistant:

ImageInput(std::string&& name) : name(name) { }